

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_queue.hpp
# Opt level: O0

void __thiscall cppurses::detail::Event_queue::clean(Event_queue *this)

{
  lock_guard<std::mutex> local_18;
  Guard_t g;
  Event_queue *this_local;
  
  g._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->mtx_);
  remove_nulls(&this->general_events_);
  remove_nulls(&this->paint_events_);
  remove_nulls(&this->delete_events_);
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return;
}

Assistant:

auto clean() -> void
    {
        Guard_t g{mtx_};
        remove_nulls(general_events_);
        remove_nulls(paint_events_);
        remove_nulls(delete_events_);
    }